

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eth_linux.c
# Opt level: O1

void * csp_eth_rx_loop(void *param)

{
  ssize_t sVar1;
  
  do {
    sVar1 = recvfrom(*(int *)((long)param + 0x98),csp_eth_rx_loop::recvbuf,3000,0,(sockaddr *)0x0,
                     (socklen_t *)0x0);
    csp_eth_rx((csp_iface_t *)((long)param + 0x10),(csp_eth_header_t *)csp_eth_rx_loop::recvbuf,
               (uint32_t)sVar1,(int *)0x0);
  } while( true );
}

Assistant:

void * csp_eth_rx_loop(void * param) {

    eth_context_t * ctx = param;

    static uint8_t recvbuf[CSP_ETH_BUF_SIZE];
    csp_eth_header_t * eth_frame = (csp_eth_header_t *)recvbuf;

    while(1) {

        /* Receive packet segment */ 

        uint32_t received_len = recvfrom(ctx->sockfd, recvbuf, CSP_ETH_BUF_SIZE, 0, NULL, NULL);

        csp_eth_rx(&ctx->ifdata.iface, eth_frame, received_len, NULL);
    }

    return NULL;
}